

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ForkHubBase::ForkHubBase
          (ForkHubBase *this,Own<kj::_::PromiseNode> *innerParam,ExceptionOrValue *resultRef)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00652858;
  (this->super_Refcounted).refcount = 0;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_0064c6a0;
  pEVar2 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0064c7b8;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0064c7f0;
  (this->inner).disposer = innerParam->disposer;
  (this->inner).ptr = innerParam->ptr;
  innerParam->ptr = (PromiseNode *)0x0;
  this->resultRef = resultRef;
  this->headBranch = (ForkBranchBase *)0x0;
  this->tailBranch = &this->headBranch;
  pPVar1 = (this->inner).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

ForkHubBase::ForkHubBase(Own<PromiseNode>&& innerParam, ExceptionOrValue& resultRef)
    : inner(kj::mv(innerParam)), resultRef(resultRef) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}